

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

int __thiscall molly::Device::close(Device *this,int __fd)

{
  MollyError *pMVar1;
  undefined4 in_register_00000034;
  allocator local_71;
  string local_70 [36];
  int local_4c;
  undefined1 local_45;
  int res;
  allocator local_31;
  string local_30 [32];
  Device *local_10;
  Device *this_local;
  
  local_10 = this;
  if (this->_fd == -1) {
    local_45 = 1;
    pMVar1 = (MollyError *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,__fd));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Device not open",&local_31);
    MollyError::MollyError(pMVar1,(string *)local_30);
    local_45 = 0;
    __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
  }
  local_4c = ::close(this->_fd);
  if (local_4c != 0) {
    pMVar1 = (MollyError *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Error closing device",&local_71);
    MollyError::MollyError(pMVar1,(string *)local_70);
    __cxa_throw(pMVar1,&MollyError::typeinfo,MollyError::~MollyError);
  }
  return 0;
}

Assistant:

void Device::close()
{
  if (_fd == INVALID_FD)
    throw MollyError("Device not open");

  int res = ::close(_fd);

  if (res != 0)
    throw MollyError("Error closing device");
}